

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

Fad<double> *
TPZMatrix<Fad<double>_>::ReturnNearestValue
          (Fad<double> *val,TPZVec<Fad<double>_> *Vec,Fad<double> *tol)

{
  Fad<double> *pFVar1;
  int64_t iVar2;
  Fad<double> *w;
  TPZVec<Fad<double>_> *in_RDX;
  Fad<double> *in_RDI;
  double dVar3;
  double dVar4;
  int64_t i;
  Fad<double> diff1;
  Fad<double> diff0;
  Fad<double> exps;
  Fad<double> *res;
  Fad<double> *in_stack_fffffffffffffe28;
  Fad<double> *in_stack_fffffffffffffe30;
  Fad<double> *in_stack_fffffffffffffe38;
  Fad<double> *in_stack_fffffffffffffe40;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *in_stack_fffffffffffffe48;
  Fad<double> *in_stack_fffffffffffffe50;
  Fad<double> *in_stack_fffffffffffffe60;
  Fad<double> *in_stack_fffffffffffffe68;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *in_stack_fffffffffffffe78;
  Fad<double> *in_stack_fffffffffffffe80;
  Fad<double> *local_110;
  Fad<double> local_100;
  undefined8 local_e0;
  byte local_d2;
  byte local_d1;
  Fad<double> local_a0 [4];
  TPZVec<Fad<double>_> *local_18;
  
  local_18 = in_RDX;
  TPZVec<Fad<double>_>::operator[](in_RDX,0);
  Fad<double>::Fad(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  operator-<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffe30);
  Fad<double>::~Fad(in_stack_fffffffffffffe30);
  local_d1 = 0;
  local_d2 = 0;
  dVar3 = fabs<double>((Fad<double> *)0x13387da);
  dVar4 = fabs<double>((Fad<double> *)0x13387ec);
  if (dVar3 < dVar4) {
    local_e0 = 0x4202a05f20000000;
    Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffffe40,&in_stack_fffffffffffffe38->val_);
  }
  else {
    pFVar1 = TPZVec<Fad<double>_>::operator[](local_18,0);
    Fad<double>::Fad(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_d1 = 1;
    operator-<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    local_d2 = 1;
    Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>(pFVar1,in_stack_fffffffffffffe78);
  }
  if ((local_d2 & 1) != 0) {
    FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffe30);
  }
  if ((local_d1 & 1) != 0) {
    Fad<double>::~Fad(in_stack_fffffffffffffe30);
  }
  Fad<double>::Fad(in_stack_fffffffffffffe40);
  TPZVec<Fad<double>_>::operator[](local_18,0);
  Fad<double>::Fad(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_110 = (Fad<double> *)0x1;
  do {
    pFVar1 = local_110;
    iVar2 = TPZVec<Fad<double>_>::NElements(local_18);
    if (iVar2 <= (long)pFVar1) {
      Fad<double>::~Fad(in_stack_fffffffffffffe30);
      Fad<double>::~Fad(in_stack_fffffffffffffe30);
      Fad<double>::~Fad(in_stack_fffffffffffffe30);
      return in_RDI;
    }
    w = TPZVec<Fad<double>_>::operator[](local_18,(int64_t)local_110);
    Fad<double>::Fad(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    operator-<Fad<double>,_Fad<double>,_nullptr>(pFVar1,w);
    Fad<double>::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffe30);
    Fad<double>::~Fad(in_stack_fffffffffffffe30);
    dVar3 = fabs<double>((Fad<double> *)0x13389e4);
    in_stack_fffffffffffffe50 = (Fad<double> *)fabs<double>((Fad<double> *)0x13389f6);
    if (dVar3 < (double)in_stack_fffffffffffffe50) {
LAB_01338a88:
      in_stack_fffffffffffffe30 = local_a0;
    }
    else {
      in_stack_fffffffffffffe48 =
           (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
           fabs<double>((Fad<double> *)0x1338a1d);
      in_stack_fffffffffffffe40 = (Fad<double> *)fabs<double>((Fad<double> *)0x1338a32);
      if ((double)in_stack_fffffffffffffe40 <= (double)in_stack_fffffffffffffe48) goto LAB_01338a88;
      in_stack_fffffffffffffe38 = TPZVec<Fad<double>_>::operator[](local_18,(int64_t)local_110);
      Fad<double>::operator=(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      in_stack_fffffffffffffe30 = &local_100;
    }
    Fad<double>::operator=(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_110 = (Fad<double> *)((long)&local_110->val_ + 1);
  } while( true );
}

Assistant:

TVar TPZMatrix<TVar>::ReturnNearestValue(TVar val, TPZVec<TVar>& Vec, TVar tol)
{
    TVar exps = val - (TVar)Vec[0];
    TVar diff0 = fabs(exps) >= fabs(tol) ?  (val - (TVar)Vec[0]) : (TVar)1.E10;
    TVar diff1, res = (TVar)Vec[0];
    for(int64_t i = 1; i < Vec.NElements(); i++)
    {
        diff1 = val - (TVar)Vec[i];
        diff0 = ( fabs(diff1) >= fabs(tol) && fabs(diff1) < fabs(diff0) ) ? res = Vec[i],diff1 : diff0;
    }
    return res;
}